

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_combo_begin_symbol(nk_context *ctx,nk_symbol_type symbol,nk_vec2 size)

{
  long lVar1;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect header_00;
  nk_rect r_00;
  nk_vec2 size_00;
  nk_rect content_00;
  nk_widget_layout_states nVar2;
  nk_symbol_type in_ESI;
  nk_command_buffer *in_RDI;
  nk_color in_XMM0_Da;
  float fVar3;
  float is_clicked_00;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float type;
  float fVar9;
  float fVar10;
  undefined4 in_XMM0_Db;
  undefined8 unaff_retaddr;
  nk_symbol_type sym;
  nk_rect button;
  nk_rect content;
  nk_rect bounds;
  nk_color symbol_color;
  nk_color sym_background;
  nk_style_item *background;
  nk_widget_layout_states s;
  int is_clicked;
  nk_rect header;
  nk_input *in;
  nk_style *style;
  nk_window *win;
  nk_context *in_stack_fffffffffffffec0;
  nk_command_buffer *in_stack_fffffffffffffec8;
  nk_color in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined8 in_stack_fffffffffffffee0;
  nk_style_button *style_00;
  nk_flags in_stack_fffffffffffffeec;
  float fVar11;
  nk_button_behavior in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  float fVar12;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  float fVar13;
  undefined4 in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  nk_size *local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  nk_user_font *font;
  float in_stack_ffffffffffffffe0;
  nk_command_buffer *out;
  nk_color in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffffc;
  int iVar14;
  
  if (((in_RDI == (nk_command_buffer *)0x0) ||
      (lVar1._0_4_ = in_RDI[0xff].clip.x, lVar1._4_4_ = in_RDI[0xff].clip.y, lVar1 == 0)) ||
     (*(long *)(*(long *)&in_RDI[0xff].clip + 0xa0) == 0)) {
    iVar14 = 0;
  }
  else {
    font = *(nk_user_font **)&in_RDI[0xff].clip;
    out = in_RDI;
    nVar2 = nk_widget((nk_rect *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    if (nVar2 == NK_WIDGET_INVALID) {
      iVar14 = 0;
    }
    else {
      r_00.y = (float)in_stack_ffffffffffffff18;
      r_00.x = (float)in_stack_ffffffffffffff14;
      r_00.w = (float)in_stack_ffffffffffffff1c;
      r_00.h = in_stack_ffffffffffffff20;
      iVar14 = nk_button_behavior((nk_flags *)
                                  CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),r_00
                                  ,(nk_input *)
                                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                  in_stack_fffffffffffffefc);
      if (((uint)out[0x7d].clip.w & 0x20) == 0) {
        if (((uint)out[0x7d].clip.w & 0x10) == 0) {
          local_58 = (nk_size *)&in_RDI[0x6a].use_clipping;
        }
        else {
          local_58 = &in_RDI[0x6a].last;
        }
      }
      else {
        local_58 = (nk_size *)&in_RDI[0x6b].use_clipping;
      }
      if ((int)*local_58 == 1) {
        nk_rgba(0,0,0,0);
        r.y = (float)in_stack_fffffffffffffedc;
        r.x = (float)in_stack_fffffffffffffed8;
        r.w = (float)(int)in_stack_fffffffffffffee0;
        r.h = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
        nk_draw_image(in_stack_fffffffffffffec8,r,(nk_image *)in_stack_fffffffffffffec0,
                      in_stack_fffffffffffffed4);
      }
      else {
        rect.y = (float)in_stack_fffffffffffffedc;
        rect.x = (float)in_stack_fffffffffffffed8;
        rect.w = (float)(int)in_stack_fffffffffffffee0;
        rect.h = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
        nk_fill_rect(in_stack_fffffffffffffec8,rect,
                     (float)((ulong)in_stack_fffffffffffffec0 >> 0x20),in_stack_fffffffffffffed4);
        rect_00.y = (float)in_stack_fffffffffffffedc;
        rect_00.x = (float)in_stack_fffffffffffffed8;
        rect_00.w = (float)(int)in_stack_fffffffffffffee0;
        rect_00.h = (float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
        nk_stroke_rect(in_stack_fffffffffffffec8,rect_00,
                       (float)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                       SUB84(in_stack_fffffffffffffec0,0),in_stack_fffffffffffffed4);
      }
      memset(&stack0xffffffffffffff14,0,0x10);
      if (((uint)out[0x7d].clip.w & 0x10) == 0) {
        if (iVar14 == 0) {
          fVar11 = in_RDI[0x6f].clip.x;
        }
        else {
          fVar11 = in_RDI[0x6f].clip.w;
        }
      }
      else {
        fVar11 = in_RDI[0x6f].clip.y;
      }
      fVar3 = fStack_3c - (*(float *)&in_RDI[0x6f].begin + *(float *)&in_RDI[0x6f].begin);
      is_clicked_00 = ((local_48 + fStack_40) - fStack_3c) - *(float *)&in_RDI[0x6f].begin;
      fVar4 = fStack_44 + *(float *)&in_RDI[0x6f].begin;
      fVar5 = is_clicked_00 + (float)in_RDI[0x6e].use_clipping;
      fVar6 = fVar3 - ((float)in_RDI[0x6e].use_clipping + (float)in_RDI[0x6e].use_clipping);
      fVar7 = fVar3 - (*(float *)&in_RDI[0x6e].field_0x1c + *(float *)&in_RDI[0x6e].field_0x1c);
      fVar8 = fStack_3c - (*(float *)&in_RDI[0x6f].userdata + *(float *)&in_RDI[0x6f].userdata);
      type = fStack_44 + *(float *)&in_RDI[0x6f].userdata;
      fVar9 = local_48 + *(float *)&in_RDI[0x6f].field_0x1c;
      fVar10 = (is_clicked_00 - *(float *)&in_RDI[0x6f].userdata) - fVar9;
      style_00 = (nk_style_button *)CONCAT44(fVar8,fVar10);
      content_00.y = (float)in_stack_fffffffffffffffc;
      content_00.x = (float)in_XMM0_Db;
      content_00._8_8_ = unaff_retaddr;
      fVar12 = fVar3;
      fVar13 = type;
      nk_draw_symbol(out,in_ESI,content_00,in_XMM0_Da,in_stack_fffffffffffffff0,
                     in_stack_ffffffffffffffe0,font);
      nk_draw_button_symbol
                ((nk_command_buffer *)CONCAT44(fVar5,fVar12),(nk_rect *)CONCAT44(fVar3,fVar4),
                 (nk_rect *)CONCAT44(is_clicked_00,fVar11),in_stack_fffffffffffffeec,style_00,
                 (nk_symbol_type)type,(nk_user_font *)CONCAT44(fVar9,fVar7));
      size_00.y = fVar8;
      size_00.x = fVar10;
      header_00.y = fVar7;
      header_00.x = fVar6;
      header_00.w = fVar9;
      header_00.h = fVar13;
      iVar14 = nk_combo_begin((nk_context *)CONCAT44(fVar5,fVar12),
                              (nk_window *)CONCAT44(fVar3,fVar4),size_00,(int)is_clicked_00,
                              header_00);
    }
  }
  return iVar14;
}

Assistant:

NK_API int
nk_combo_begin_symbol(struct nk_context *ctx, enum nk_symbol_type symbol, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    const struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;
    struct nk_color sym_background;
    struct nk_color symbol_color;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (s == NK_WIDGET_INVALID)
        return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        symbol_color = style->combo.symbol_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        symbol_color = style->combo.symbol_hover;
    } else {
        background = &style->combo.normal;
        symbol_color = style->combo.symbol_hover;
    }

    if (background->type == NK_STYLE_ITEM_IMAGE) {
        sym_background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        sym_background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect bounds = {0,0,0,0};
        struct nk_rect content;
        struct nk_rect button;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.y;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;

        /* draw symbol */
        bounds.h = header.h - 2 * style->combo.content_padding.y;
        bounds.y = header.y + style->combo.content_padding.y;
        bounds.x = header.x + style->combo.content_padding.x;
        bounds.w = (button.x - style->combo.content_padding.y) - bounds.x;
        nk_draw_symbol(&win->buffer, symbol, bounds, sym_background, symbol_color,
            1.0f, style->font);

        /* draw open/close button */
        nk_draw_button_symbol(&win->buffer, &bounds, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}